

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::ImplicitTrapezoidal
          (ImplicitTrapezoidal *this,
          shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *dynamicalSystem)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> local_a0;
  CollocationHessianSparsityMap *local_90;
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  *local_88;
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  *local_80;
  MatrixDynSize *local_78;
  MatrixDynSize *local_70;
  MatrixDynSize *local_68;
  MatrixDynSize *local_60;
  MatrixDynSize *local_58;
  MatrixDynSize *local_50;
  MatrixDynSize *local_48;
  VectorDynSize *local_40;
  VectorDynSize *local_38;
  
  local_a0.super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (dynamicalSystem->
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_a0.super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (dynamicalSystem->
       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_a0.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.
       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.
       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  FixedStepIntegrator::FixedStepIntegrator(&this->super_FixedStepIntegrator,&local_a0);
  if (local_a0.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.
               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__ImplicitTrapezoidal_0019b498;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_computationBuffer);
  local_38 = &this->m_computationBuffer;
  iDynTree::VectorDynSize::VectorDynSize(&this->m_computationBuffer2);
  local_40 = &this->m_computationBuffer2;
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_identity);
  local_48 = &this->m_identity;
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_stateJacBuffer);
  local_50 = &this->m_stateJacBuffer;
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_controlJacBuffer);
  local_60 = &this->m_zeroNxNxBuffer;
  local_58 = &this->m_controlJacBuffer;
  iDynTree::MatrixDynSize::MatrixDynSize(local_60);
  local_68 = &this->m_zeroNuNuBuffer;
  iDynTree::MatrixDynSize::MatrixDynSize(local_68);
  local_70 = &this->m_zeroNxNuBuffer;
  iDynTree::MatrixDynSize::MatrixDynSize(local_70);
  local_78 = &this->m_stateHessianBuffer;
  iDynTree::MatrixDynSize::MatrixDynSize(local_78);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_controlHessianBuffer);
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_mixedHessianBuffer);
  iDynTree::VectorDynSize::VectorDynSize(&this->m_lambda);
  this->m_hasStateJacobianSparsity = false;
  this->m_hasControlJacobianSparsity = false;
  local_80 = &this->m_stateJacobianSparsity;
  local_88 = &this->m_controlJacobianSparsity;
  local_90 = &this->m_stateHessianSparsity;
  p_Var1 = &(this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_stateJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stateJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stateJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_controlJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_controlJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_controlJacobianSparsity).
  super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->m_controlJacobianSparsity).
           super__Vector_base<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_stateHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_stateControlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_controlHessianSparsity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_infoData.
           super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__cxx11::string::_M_replace((ulong)peVar2,0,(char *)(peVar2->name)._M_string_length,0x1853c9)
  ;
  peVar2 = (this->super_FixedStepIntegrator).super_Integrator.m_infoData.
           super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2->isExplicit = false;
  peVar2->numberOfStages = 1;
  (*(this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator[0xf])(this);
  return;
}

Assistant:

ImplicitTrapezoidal::ImplicitTrapezoidal(const std::shared_ptr<DynamicalSystem> dynamicalSystem) : FixedStepIntegrator(dynamicalSystem)
            {
                m_infoData->name = "ImplicitTrapezoidal";
                m_infoData->isExplicit = false;
                m_infoData->numberOfStages = 1;
                allocateBuffers();
            }